

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<char[20],unsigned_long,bool>
               (ostream *out,char *fmt,char (*args) [20],unsigned_long *args_1,bool *args_2)

{
  ostream *in_RSI;
  bool *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff58;
  char local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<char[20],unsigned_long,bool>
            ((char (*) [20])local_60,(unsigned_long *)in_RSI,in_RDI);
  vformat(in_RSI,in_RDI,in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}